

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O0

void array_suite::test_int_four(void)

{
  string local_230 [40];
  int aiStack_208 [2];
  int array [4];
  undefined1 local_1e8 [8];
  oarchive ar;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            ((basic_oarchive<char> *)local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  aiStack_208[0] = 1;
  aiStack_208[1] = 2;
  array[0] = 3;
  array[1] = 4;
  boost::archive::detail::interface_oarchive<trial::protocol::json::basic_oarchive<char>>::
  operator<<((interface_oarchive<trial::protocol::json::basic_oarchive<char>> *)local_1e8,
             (int (*) [4])aiStack_208);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[10]>
            ("result.str()","\"[1,2,3,4]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x123,"void array_suite::test_int_four()",local_230,"[1,2,3,4]");
  std::__cxx11::string::~string(local_230);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive((basic_oarchive<char> *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_int_four()
{
    std::ostringstream result;
    json::oarchive ar(result);
    int array[] = { 1, 2, 3, 4 };
    ar << array;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[1,2,3,4]");
}